

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluxOut.cpp
# Opt level: O2

void __thiscall OpenMD::FluxOut::doFrame(FluxOut *this,int frame)

{
  Snapshot *this_00;
  pointer pdVar1;
  pointer piVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  SelectionSet local_30;
  
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ == true) {
    SelectionEvaluator::evaluate(&local_30,&(this->super_SequentialAnalyzer).evaluator1_);
    SelectionManager::setSelectionSet(&(this->super_SequentialAnalyzer).seleMan1_,&local_30);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_30.bitsets_);
  }
  iVar3 = SelectionManager::getSelectionCount(&(this->super_SequentialAnalyzer).seleMan1_);
  local_30.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_30.bitsets_.
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar3);
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->counts_,(int *)&local_30);
  this_00 = (this->super_SequentialAnalyzer).currentSnapshot_;
  if (this->axis_ == 1) {
    dVar5 = Snapshot::getXZarea(this_00);
  }
  else if (this->axis_ == 0) {
    dVar5 = Snapshot::getYZarea(this_00);
  }
  else {
    dVar5 = Snapshot::getXYarea(this_00);
  }
  pdVar1 = (this->super_SequentialAnalyzer).times_.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar4 = (uint)((long)(this->super_SequentialAnalyzer).times_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar1 >> 3);
  if (1 < (int)uVar4) {
    piVar2 = (this->counts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_30.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((double)(piVar2[uVar4 & 0x7fffffff] - piVar2[uVar4 - 1]) /
                  ((pdVar1[uVar4 & 0x7fffffff] - pdVar1[uVar4 - 1]) * (dVar5 + dVar5)));
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->values_,(double *)&local_30);
  }
  return;
}

Assistant:

void FluxOut::doFrame(int frame) {
    StuntDouble* sd;
    int i;
    
    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    
    unsigned int count1 = seleMan1_.getSelectionCount();
    counts_.push_back(count1);

    RealType area;
    switch (axis_) {
    case 0:
      area = 2.0 * currentSnapshot_->getYZarea();
      break;
    case 1:
      area = 2.0 * currentSnapshot_->getXZarea();
      break;
    case 2:
    default:
      area = 2.0 * currentSnapshot_->getXYarea();
    }

    int n = times_.size();
    if (n > 1) {
      RealType deltaT = times_[n] - times_[n-1];
      RealType deltaC = counts_[n] - counts_[n-1];      
      values_.push_back(deltaC / (area * deltaT));
    }
  }